

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleinterp.cpp
# Opt level: O2

void __thiscall BrainFuckInterpreter::interpret(BrainFuckInterpreter *this)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  invalid_argument *this_00;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  memset(this->tape_,0,30000);
  this->dc_ = 0;
  this->pc_ = 0;
  pcVar2 = (this->p_).program._M_dataplus._M_p;
  uVar3 = (this->p_).program._M_string_length;
  uVar7 = 0;
  do {
    if (uVar3 <= uVar7) {
      return;
    }
    cVar1 = pcVar2[uVar7];
    switch(cVar1) {
    case '+':
      this->tape_[this->dc_] = this->tape_[this->dc_] + '\x01';
      break;
    case ',':
      uVar4 = std::istream::get();
      this->tape_[this->dc_] = uVar4;
      break;
    case '-':
      this->tape_[this->dc_] = this->tape_[this->dc_] + 0xff;
      break;
    case '.':
      std::ostream::put(-0x78);
      break;
    default:
      if (cVar1 == '<') {
        uVar5 = this->dc_ - 1;
        if (this->dc_ == 0) {
          uVar5 = 29999;
        }
      }
      else {
        if (cVar1 != '>') {
          if (cVar1 == '[') {
            if (this->tape_[this->dc_] == '\0') {
              iVar9 = 1;
              while (0 < iVar9) {
                uVar6 = (int)uVar7 + 1;
                uVar7 = (ulong)uVar6;
                this->pc_ = uVar6;
                if (uVar3 <= uVar7) break;
                if (pcVar2[uVar7] == ']') {
                  iVar9 = iVar9 + -1;
                }
                else if (pcVar2[uVar7] == '[') {
                  iVar9 = iVar9 + 1;
                }
              }
            }
          }
          else {
            if (cVar1 != ']') {
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this_00,"Unknown command");
              __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            iVar9 = 1;
            uVar8 = uVar7;
LAB_001025ad:
            uVar10 = uVar8 - 1;
            if ((0 < iVar9) && (uVar8 != 0)) {
              this->pc_ = (int)uVar8 - 1;
              uVar8 = uVar10;
              if (pcVar2[uVar10 & 0xffffffff] != ']') goto code_r0x001025da;
              iVar9 = iVar9 + 1;
              goto LAB_001025ea;
            }
            this->pc_ = (int)uVar7 - 1;
          }
          break;
        }
        uVar5 = this->dc_ + 1;
        if (uVar5 == 30000) {
          uVar5 = 0;
        }
      }
      this->dc_ = uVar5;
    }
    uVar6 = this->pc_ + 1;
    uVar7 = (ulong)uVar6;
    this->pc_ = uVar6;
  } while( true );
code_r0x001025da:
  uVar7 = uVar10 & 0xffffffff;
  if (pcVar2[uVar10 & 0xffffffff] == '[') {
    iVar9 = iVar9 + -1;
LAB_001025ea:
    uVar7 = uVar10 & 0xffffffff;
  }
  goto LAB_001025ad;
}

Assistant:

void interpret() {
        memset(tape_, 0, TAPE_SIZE);
        dc_ = 0;
        pc_ = 0;

        auto n = p_.program.length();
        const char* p = p_.program.data();
        int nesting {0};

        while (pc_ < n) {
            const char ch = p[pc_];
            char dch;
            switch (ch)
            {
                case '+':
                    tape_[dc_]++;
                    break;
                case '-':
                    tape_[dc_]--;
                    break;
                case '>':
                    dc_++;
                    if (dc_ == TAPE_SIZE)
                        dc_ = 0;
                    break;
                case '<':
                    dc_--;
                    if (dc_ == -1)
                        dc_ = TAPE_SIZE - 1;
                    break;
                case '.':
                    dch = tape_[dc_];
                    std::cout.put(dch);
                    break;
                case ',':
                    tape_[dc_] = std::cin.get();
                    break;
                case '[':
                    if (tape_[dc_] == 0) {
                        nesting = 1;
                        while (nesting > 0 && ++pc_ < n) {
                            if (p[pc_] == '[') {
                                nesting++;
                            } else if (p[pc_] == ']') {
                                nesting--;
                            }
                        }
                    }
                    break;
                case ']':
                    nesting = 1;
                    while (nesting > 0 && pc_ > 0) {
                        pc_--;
                        if (p[pc_] == '[') {
                            nesting--;
                        } else if (p[pc_] == ']') {
                            nesting++;
                        }
                    }
                    pc_--;
                    break;

                default:
                    throw std::invalid_argument("Unknown command");
            }
            pc_++;
        }
    }